

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int24_To_Int8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  PaInt32 PVar4;
  int in_ECX;
  byte *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  int in_R8D;
  PaUtilTriangularDitherGenerator *in_R9;
  PaInt32 dither;
  PaInt32 temp;
  char *dest;
  uchar *src;
  undefined1 *local_38;
  byte *local_30;
  int local_20;
  
  local_38 = in_RDI;
  local_30 = in_RDX;
  local_20 = in_R8D;
  while (local_20 != 0) {
    bVar1 = *local_30;
    bVar2 = local_30[1];
    bVar3 = local_30[2];
    PVar4 = PaUtil_Generate16BitTriangularDither(in_R9);
    *local_38 = (char)(((int)((uint)bVar1 << 8 | (uint)bVar2 << 0x10 | (uint)bVar3 << 0x18) >> 1) +
                       PVar4 >> 0x17);
    local_30 = local_30 + in_ECX * 3;
    local_38 = local_38 + in_ESI;
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

static void Int24_To_Int8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    signed char  *dest = (signed char*)destinationBuffer;
    
    PaInt32 temp, dither;

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        temp = (((PaInt32)src[0]) << 8);  
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 24);
#elif defined(PA_BIG_ENDIAN)
        temp = (((PaInt32)src[0]) << 24);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 8);
#endif

        /* REVIEW */
        dither = PaUtil_Generate16BitTriangularDither( ditherGenerator );
        *dest = (signed char) (((temp >> 1) + dither) >> 23);

        src += sourceStride * 3;
        dest += destinationStride;
    }
}